

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O3

void __thiscall wasm::AlignmentLowering::visitStore(AlignmentLowering *this,Store *curr)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  Index index;
  Drop *pDVar3;
  Block *expression;
  Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_> *pWVar4;
  Memory *pMVar5;
  Expression *pEVar6;
  Unary *pUVar7;
  Store *pSVar8;
  Const *pCVar9;
  Binary *this_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  Type in_R8;
  Module *this_01;
  Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_> *value;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 local_c8 [16];
  Drop local_b8;
  Expression *local_a0;
  LocalSet *local_90;
  LocalSet *local_88;
  address64_t local_80;
  address64_t local_78;
  address64_t aStack_70;
  ulong local_60;
  Expression *local_58;
  Index local_4c;
  Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_> *local_48;
  Store *local_40;
  Builder local_38;
  Builder builder;
  
  pWVar4 = &(this->
            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
            ).
            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
            .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>;
  this_01 = (this->
            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
            ).
            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
            .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
            currModule;
  local_38.wasm = this_01;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id == 1) {
    pEVar6 = curr->ptr;
    pDVar3 = (Drop *)MixedArena::allocSpace(&this_01->allocator,0x18,8);
    (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar3->value = pEVar6;
    local_48 = pWVar4;
    Drop::finalize(pDVar3);
    pEVar6 = curr->value;
    local_c8._0_8_ = pDVar3;
    pDVar3 = (Drop *)MixedArena::allocSpace(&this_01->allocator,0x18,8);
    (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar3->value = pEVar6;
    Drop::finalize(pDVar3);
    local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 2;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
    local_c8._8_8_ = pDVar3;
    local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (LocalSet *)local_c8;
    expression = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                           (&local_38,(initializer_list<wasm::Expression_*> *)&local_b8,type);
    pWVar4 = local_48;
    goto LAB_007a0589;
  }
  uVar1 = (curr->align).addr;
  if (uVar1 == 0) {
    return;
  }
  if (uVar1 == curr->bytes) {
    return;
  }
  value = (Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_> *)
          curr->value;
  uVar1 = (value->stack).usedFixed;
  local_40 = curr;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  switch((int)uVar1) {
  case 2:
    break;
  case 3:
    if (curr->bytes == 8) goto LAB_007a01d1;
    (curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 2;
    pUVar7 = Builder::makeUnary(&local_38,WrapInt64,(Expression *)value);
    curr->value = (Expression *)pUVar7;
    break;
  case 4:
    (curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 2;
    local_48 = value;
    pUVar7 = (Unary *)MixedArena::allocSpace(&this_01->allocator,0x20,8);
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar7->op = ReinterpretFloat32;
    pUVar7->value = (Expression *)local_48;
    Unary::finalize(pUVar7);
    curr->value = (Expression *)pUVar7;
    break;
  case 5:
    local_48 = pWVar4;
    pWVar4 = (Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_> *)
             MixedArena::allocSpace(&this_01->allocator,0x20,8);
    (((SpecificExpression<(wasm::Expression::Id)15> *)&pWVar4->replacep)->super_Expression)._id =
         UnaryId;
    (pWVar4->stack).usedFixed = 0;
    *(undefined4 *)&(pWVar4->stack).fixed._M_elems[0].func = 0x22;
    (pWVar4->stack).fixed._M_elems[0].currp = (Expression **)value;
    Unary::finalize((Unary *)pWVar4);
    this_01 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
              ).
              super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
              .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
              currModule;
    value = pWVar4;
    pWVar4 = local_48;
LAB_007a01d1:
    local_48 = pWVar4;
    pSVar8 = local_40;
    pMVar5 = Module::getMemory(this_01,(Name)(local_40->memory).super_IString.str);
    local_60 = (pMVar5->addressType).id;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_60;
    local_4c = Builder::addVar((Builder *)
                               (this->
                               super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                               ).
                               super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .
                               super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .currFunction,(Function *)0x0,(Name)(auVar2 << 0x40),in_R8);
    local_90 = Builder::makeLocalSet(&local_38,local_4c,pSVar8->ptr);
    index = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,(Function *)0x0,(Name)(ZEXT816(3) << 0x40),in_R8);
    local_78 = CONCAT44(local_78._4_4_,index);
    local_88 = Builder::makeLocalSet(&local_38,index,(Expression *)value);
    pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    *(Index *)(pEVar6 + 1) = index;
    (pEVar6->type).id = 3;
    pUVar7 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar7->op = WrapInt64;
    pUVar7->value = pEVar6;
    Unary::finalize(pUVar7);
    pSVar8 = local_40;
    local_58 = (Expression *)(local_40->offset).addr;
    local_80 = (address64_t)(uint)(local_40->align).addr;
    pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    *(Index *)(pEVar6 + 1) = local_4c;
    (pEVar6->type).id = local_60;
    local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (pSVar8->memory).super_IString.str._M_len;
    local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(pSVar8->memory).super_IString.str._M_str;
    pSVar8 = (Store *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar8->bytes = 0;
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 0;
    *(undefined8 *)&pSVar8->isAtomic = 0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    pSVar8->bytes = '\x04';
    (pSVar8->offset).addr = (address64_t)local_58;
    (pSVar8->align).addr = local_80;
    pSVar8->ptr = pEVar6;
    pSVar8->value = (Expression *)pUVar7;
    (pSVar8->valueType).id = 2;
    (pSVar8->memory).super_IString.str._M_len =
         local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (pSVar8->memory).super_IString.str._M_str =
         (char *)local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    Store::finalize(pSVar8);
    local_58 = lowerStoreI32(this,pSVar8);
    pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    *(undefined4 *)(pEVar6 + 1) = (undefined4)local_78;
    (pEVar6->type).id = 3;
    pCVar9 = Builder::makeConst<long>(&local_38,0x20);
    this_00 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_00->op = ShrUInt64;
    this_00->left = pEVar6;
    this_00->right = (Expression *)pCVar9;
    Binary::finalize(this_00);
    pUVar7 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar7->op = WrapInt64;
    pUVar7->value = (Expression *)this_00;
    Unary::finalize(pUVar7);
    pSVar8 = local_40;
    local_78 = (local_40->offset).addr;
    aStack_70 = (local_40->align).addr;
    pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    *(Index *)(pEVar6 + 1) = local_4c;
    (pEVar6->type).id = local_60;
    local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (pSVar8->memory).super_IString.str._M_len;
    local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(pSVar8->memory).super_IString.str._M_str;
    pSVar8 = (Store *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar8->bytes = 0;
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 0;
    *(undefined8 *)&pSVar8->isAtomic = 0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    uVar1 = DAT_00dc6db0._8_8_;
    pSVar8->bytes = '\x04';
    (pSVar8->offset).addr = local_78 + 4;
    (pSVar8->align).addr = aStack_70 & uVar1;
    pSVar8->ptr = pEVar6;
    pSVar8->value = (Expression *)pUVar7;
    (pSVar8->valueType).id = 2;
    (pSVar8->memory).super_IString.str._M_len =
         local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (pSVar8->memory).super_IString.str._M_str =
         (char *)local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    Store::finalize(pSVar8);
    local_a0 = lowerStoreI32(this,pSVar8);
    local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = local_90;
    local_b8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)local_88;
    local_b8.value = local_58;
    local_c8._8_8_ = (Drop *)0x4;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)extraout_RDX_00;
    local_c8._0_8_ = &local_b8;
    expression = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                           (&local_38,(initializer_list<wasm::Expression_*> *)local_c8,type_00);
    pWVar4 = local_48;
    goto LAB_007a0589;
  default:
    handle_unreachable("unhandled unaligned store",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                       ,0x14e);
  }
  expression = (Block *)lowerStoreI32(this,curr);
LAB_007a0589:
  Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
            (pWVar4,(Expression *)expression);
  return;
}

Assistant:

void visitStore(Store* curr) {
    Builder builder(*getModule());
    // If unreachable, just remove the store, which removes the unaligned
    // operation in a trivial way.
    if (curr->type == Type::unreachable) {
      replaceCurrent(builder.makeBlock(
        {builder.makeDrop(curr->ptr), builder.makeDrop(curr->value)}));
      return;
    }
    if (curr->align == 0 || curr->align == curr->bytes) {
      // Nothing to do: leave the node unchanged. All code lower down assumes
      // the operation is unaligned.
      return;
    }
    auto type = curr->value->type.getBasic();
    Expression* replacement;
    switch (type) {
      default:
        WASM_UNREACHABLE("unhandled unaligned store");
      case Type::i32:
        replacement = lowerStoreI32(curr);
        break;
      case Type::f32:
        curr->type = Type::i32;
        curr->value = builder.makeUnary(ReinterpretFloat32, curr->value);
        replacement = lowerStoreI32(curr);
        break;
      case Type::i64:
      case Type::f64:
        if (type == Type::i64 && curr->bytes != 8) {
          // A store of <64 bits.
          curr->type = Type::i32;
          curr->value = builder.makeUnary(WrapInt64, curr->value);
          replacement = lowerStoreI32(curr);
          break;
        }
        // Otherwise, fall through to f64 case for a 64-bit load.
        // Ensure an integer input value.
        auto* value = curr->value;
        if (type == Type::f64) {
          value = builder.makeUnary(ReinterpretFloat64, value);
        }
        // Store as two 32-bit pieces.
        auto mem = getModule()->getMemory(curr->memory);
        auto addressType = mem->addressType;
        auto tempPtr = builder.addVar(getFunction(), addressType);
        auto* setPtr = builder.makeLocalSet(tempPtr, curr->ptr);
        auto tempValue = builder.addVar(getFunction(), Type::i64);
        auto* setValue = builder.makeLocalSet(tempValue, value);
        Expression* low = builder.makeUnary(
          WrapInt64, builder.makeLocalGet(tempValue, Type::i64));
        low = lowerStoreI32(
          builder.makeStore(4,
                            curr->offset,
                            curr->align,
                            builder.makeLocalGet(tempPtr, addressType),
                            low,
                            Type::i32,
                            curr->memory));
        Expression* high =
          builder.makeBinary(ShrUInt64,
                             builder.makeLocalGet(tempValue, Type::i64),
                             builder.makeConst(int64_t(32)));
        high = builder.makeUnary(WrapInt64, high);
        // Note that the alignment is assumed to be the same here, even though
        // we add an offset of 4. That is because this is an unaligned store, so
        // the alignment is 1, 2, or 4, which means it stays the same after
        // adding 4.
        high = lowerStoreI32(
          builder.makeStore(4,
                            curr->offset + 4,
                            curr->align,
                            builder.makeLocalGet(tempPtr, addressType),
                            high,
                            Type::i32,
                            curr->memory));
        replacement = builder.makeBlock({setPtr, setValue, low, high});
        break;
    }
    replaceCurrent(replacement);
  }